

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

int array_equals(uint32_t *a1,int32_t size1,uint32_t *a2,int32_t size2)

{
  int i;
  int32_t size2_local;
  uint32_t *a2_local;
  int32_t size1_local;
  uint32_t *a1_local;
  int local_4;
  
  if (size1 == size2) {
    for (i = 0; i < size1; i = i + 1) {
      if (a1[i] != a2[i]) {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int array_equals(const uint32_t *a1, int32_t size1, const uint32_t *a2,
                        int32_t size2) {
    if (size1 != size2) return 0;
    for (int i = 0; i < size1; ++i) {
        if (a1[i] != a2[i]) {
            return 0;
        }
    }
    return 1;
}